

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cpp
# Opt level: O0

int __thiscall
ncnn::Interp::forward
          (Interp *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  void *pvVar1;
  size_t sVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  const_reference pvVar7;
  int iVar8;
  ulong uVar9;
  int *piVar10;
  void *pvVar11;
  float *pfVar12;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  long lVar13;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  int *in_RDI;
  bool bVar14;
  Mat dst_1;
  Mat src_1;
  int q_3;
  float *beta_1;
  float *alpha_3;
  int *yofs_1;
  int *xofs_3;
  int *buf_3;
  Mat dst;
  Mat src;
  int q_2;
  float *beta;
  float *alpha_2;
  int *yofs;
  int *xofs_2;
  int *buf_2;
  int in_x_1;
  int x_3;
  int in_y;
  int y_3;
  float *outptr_3;
  float *ptr_4;
  int q_1;
  float ws_1;
  float hs;
  float a3;
  float a2;
  float a1_1;
  float a0_1;
  float *Sp_1;
  int sx_1;
  int x_2;
  float *alphap_1;
  float *outptr_2;
  float *ptr_3;
  int y_2;
  float *alpha_1;
  int *xofs_1;
  int *buf_1;
  float a1;
  float a0;
  float *Sp;
  int sx;
  int x_1;
  float *alphap;
  float *outptr_1;
  float *ptr_2;
  int y_1;
  float *alpha;
  int *xofs;
  int *buf;
  int in_x;
  int x;
  float *outptr;
  float *ptr_1;
  int y;
  float ws;
  float v;
  Mat top_blob_c;
  int q;
  int r;
  int outh;
  int outw;
  size_t elemsize;
  int dims;
  int channels;
  int h;
  int w;
  Mat *top_blob;
  Mat *reference_blob;
  Mat *bottom_blob;
  Mat *m_6;
  Mat *m_4;
  Mat *m_2;
  Mat *m;
  int i;
  float *ptr;
  int size;
  Mat *m_5;
  Mat *m_3;
  Mat *m_1;
  undefined4 in_stack_fffffffffffff3f8;
  int in_stack_fffffffffffff3fc;
  Allocator *in_stack_fffffffffffff400;
  int *in_stack_fffffffffffff408;
  void **ppvVar15;
  Mat *in_stack_fffffffffffff410;
  undefined8 *puVar16;
  undefined8 in_stack_fffffffffffff418;
  int _w;
  Mat *in_stack_fffffffffffff420;
  int *in_stack_fffffffffffff430;
  int *in_stack_fffffffffffff438;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_stack_fffffffffffff440;
  Interp *in_stack_fffffffffffff448;
  float local_b10;
  float local_b0c;
  float local_ad4;
  float *in_stack_fffffffffffff590;
  int *in_stack_fffffffffffff598;
  float *in_stack_fffffffffffff5a0;
  Mat *in_stack_fffffffffffff5a8;
  Mat *in_stack_fffffffffffff5b0;
  Allocator *pAVar17;
  void *local_a28;
  int *local_a20;
  ulong local_a18;
  int local_a10;
  Allocator *local_a08;
  int local_a00;
  int local_9fc;
  int local_9f8;
  undefined4 local_9f4;
  int local_9f0;
  ulong local_9e8;
  int local_9dc;
  long local_9d8;
  long local_9d0;
  void *local_9c8;
  void *local_9c0;
  void *local_9b8;
  void *local_9b0;
  int *local_9a8;
  ulong local_9a0;
  int local_998;
  Allocator *local_990;
  int local_988;
  int local_984;
  int local_980;
  undefined4 local_97c;
  int local_978;
  ulong local_970;
  void *local_968;
  int *local_960;
  ulong local_958;
  int local_950;
  Allocator *local_948;
  int local_940;
  int local_93c;
  int local_938;
  undefined4 local_934;
  int local_930;
  ulong local_928;
  int local_91c;
  long local_918;
  long local_910;
  void *local_908;
  void *local_900;
  void *local_8f8;
  int local_8f0;
  int local_8ec;
  int local_8e8;
  int local_8e4;
  int local_8e0;
  int local_8dc;
  int local_8d8;
  int local_8d4;
  undefined8 local_8d0;
  undefined8 local_8c8;
  undefined8 local_8c0;
  undefined4 local_8b8;
  Allocator *local_8b0;
  undefined4 local_8a8;
  undefined4 local_8a4;
  undefined4 local_8a0;
  undefined4 local_89c;
  undefined4 local_898;
  undefined8 local_890;
  undefined4 *local_888;
  undefined8 local_880;
  undefined8 local_878;
  undefined8 local_870;
  undefined4 local_868;
  Allocator *local_860;
  undefined4 in_stack_fffffffffffff7a8;
  undefined4 in_stack_fffffffffffff7ac;
  float *in_stack_fffffffffffff7b0;
  undefined4 uVar18;
  int *in_stack_fffffffffffff7b8;
  float *in_stack_fffffffffffff7c0;
  Mat *in_stack_fffffffffffff7c8;
  undefined4 in_stack_fffffffffffff7d0;
  int in_stack_fffffffffffff7d4;
  int local_804;
  float *local_800;
  float *local_7f8;
  int local_7e4;
  int local_7b4;
  float *local_7b0;
  float *local_7a8;
  int local_794;
  int local_778;
  int local_774;
  int local_770;
  int local_76c;
  undefined4 *local_768;
  void *local_760;
  int local_754;
  float local_750;
  int local_6f8;
  int local_6f0;
  undefined4 local_6ec;
  int local_6e8;
  int local_6e4;
  size_t local_6e0;
  int local_6d8;
  int local_6d4;
  int local_6d0;
  int local_6cc;
  const_reference local_6c8;
  const_reference local_6c0;
  const_reference local_6b8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_6a8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_6a0;
  int local_68c;
  int local_688;
  undefined4 local_684;
  const_reference local_680;
  const_reference local_678;
  int local_668;
  undefined4 local_664;
  const_reference local_660;
  const_reference local_658;
  undefined8 *local_638;
  undefined8 *local_628;
  void **local_618;
  void **local_608;
  undefined8 *local_5f8;
  void **local_5e8;
  const_reference local_5d8;
  const_reference local_5d0;
  undefined1 local_5bd;
  int local_5bc;
  const_reference local_5b8;
  undefined1 *local_5b0;
  undefined1 local_59d;
  int local_59c;
  const_reference local_598;
  void **local_590;
  undefined1 local_57d;
  int local_57c;
  const_reference local_578;
  undefined8 *local_570;
  int local_52c;
  undefined4 *local_528;
  int local_50c;
  const_reference local_508;
  int local_4fc;
  const_reference local_4f8;
  int local_4ec;
  const_reference local_4e8;
  int local_4dc;
  const_reference local_4d8;
  int local_4cc;
  const_reference local_4c8;
  int local_4bc;
  const_reference local_4b8;
  undefined1 local_4ad;
  int local_4ac;
  const_reference local_4a8;
  void **local_4a0;
  undefined1 local_48d;
  int local_48c;
  const_reference local_488;
  void **local_480;
  undefined1 local_46d;
  int local_46c;
  const_reference local_468;
  undefined8 *local_460;
  undefined8 *local_450;
  undefined8 *local_448;
  int local_3c0;
  undefined4 local_3bc;
  void **local_3b8;
  int local_3a0;
  undefined4 local_39c;
  undefined8 *local_398;
  int local_380;
  undefined4 local_37c;
  void **local_378;
  int local_360;
  undefined4 local_35c;
  void **local_358;
  undefined8 *local_338;
  undefined8 *local_318;
  int local_2f0;
  undefined4 local_2ec;
  const_reference local_2e8;
  int local_2e0;
  undefined4 local_2dc;
  const_reference local_2d8;
  void *local_2d0;
  void *local_2c8;
  void *local_290;
  void *local_280;
  void *local_260;
  const_reference local_208;
  const_reference local_200;
  Allocator *local_1f8;
  int local_1ec;
  size_t local_1e8;
  Mat *local_1e0;
  int local_1d4;
  int local_1d0;
  int local_1cc;
  undefined8 *local_1c8;
  Allocator *local_1c0;
  int local_1b4;
  ulong local_1b0;
  void *local_1a8;
  int local_19c;
  int local_198;
  int local_194;
  void **local_190;
  Allocator *local_188;
  int local_17c;
  ulong local_178;
  void *local_170;
  int local_164;
  int local_160;
  int local_15c;
  void **local_158;
  Allocator *local_118;
  int local_10c;
  size_t local_108;
  undefined4 *local_100;
  int local_f4;
  int local_f0;
  int local_ec;
  undefined8 *local_e8;
  Allocator *local_e0;
  int local_d4;
  ulong local_d0;
  void *local_c8;
  int local_bc;
  int local_b8;
  int local_b4;
  void **local_b0;
  Allocator *local_a8;
  int local_9c;
  size_t local_98;
  void *local_90;
  int local_84;
  int local_80;
  int local_7c;
  undefined1 *local_78;
  undefined4 local_6c;
  long local_68;
  undefined4 local_5c;
  long local_58;
  undefined4 local_4c;
  long local_48;
  undefined4 local_2c;
  long local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  
  local_6a8 = in_RDX;
  local_6a0 = in_RSI;
  local_6b8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_6c0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_6a0,1);
  local_6c8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_6a8,0);
  local_6cc = local_6b8->w;
  local_6d0 = local_6b8->h;
  local_6d4 = local_6b8->c;
  local_6d8 = local_6b8->dims;
  local_6e0 = local_6b8->elemsize;
  local_6e4 = local_6c0->w;
  local_6e8 = local_6c0->h;
  uVar9 = std::__cxx11::string::empty();
  if ((uVar9 & 1) == 0) {
    iVar8 = eval_size_expr(in_stack_fffffffffffff448,in_stack_fffffffffffff440,
                           in_stack_fffffffffffff438,in_stack_fffffffffffff430);
    if (iVar8 != 0) {
      return -1;
    }
    local_6ec = 0;
  }
  pvVar7 = local_6c8;
  iVar8 = (int)((ulong)in_stack_fffffffffffff410 >> 0x20);
  _w = (int)((ulong)in_stack_fffffffffffff418 >> 0x20);
  if (local_6d8 == 1) {
    Mat::create(in_stack_fffffffffffff420,_w,(int)in_stack_fffffffffffff418,iVar8,
                (size_t)in_stack_fffffffffffff408,in_stack_fffffffffffff400);
    bVar14 = true;
    if (local_6c8->data != (void *)0x0) {
      bVar14 = local_6c8->cstep * (long)local_6c8->c == 0;
    }
    if (bVar14) {
      local_68c = -100;
    }
    else {
      for (local_6f0 = 0; local_6f0 < local_6cc; local_6f0 = local_6f0 + 1) {
        iVar8 = local_6c8->d;
        local_6f8 = (int)(((long)local_6c8->w * (long)local_6c8->h * local_6c8->elemsize + 0xf &
                          0xfffffffffffffff0) / local_6c8->elemsize);
        if (local_6c8->dims == 4) {
          local_6f8 = local_6c8->w * local_6c8->h;
        }
        uVar18 = *(undefined4 *)((long)local_6b8->data + (long)local_6f0 * 4);
        local_528 = (undefined4 *)
                    ((long)local_6c8->data +
                    local_6c8->cstep * (long)local_6f0 * local_6c8->elemsize);
        for (local_52c = 0; local_52c < local_6f8 * iVar8; local_52c = local_52c + 1) {
          *local_528 = uVar18;
          local_528 = local_528 + 1;
        }
      }
      local_68c = 0;
    }
  }
  else if (local_6d8 == 2) {
    if (local_6e4 == local_6cc) {
      local_658 = local_6c8;
      local_660 = local_6b8;
      if (local_6c8 != local_6b8) {
        if (local_6b8->refcount != (int *)0x0) {
          piVar10 = local_6b8->refcount;
          local_664 = 1;
          LOCK();
          local_668 = *piVar10;
          *piVar10 = *piVar10 + 1;
          UNLOCK();
        }
        local_2e8 = local_6c8;
        if (local_6c8->refcount != (int *)0x0) {
          piVar10 = local_6c8->refcount;
          local_2ec = 0xffffffff;
          LOCK();
          local_2f0 = *piVar10;
          *piVar10 = *piVar10 + -1;
          UNLOCK();
          if (local_2f0 == 1) {
            if (local_6c8->allocator == (Allocator *)0x0) {
              local_2c8 = local_6c8->data;
              if (local_2c8 != (void *)0x0) {
                free(local_2c8);
              }
            }
            else {
              (*local_6c8->allocator->_vptr_Allocator[3])(local_6c8->allocator,local_6c8->data);
            }
          }
        }
        pvVar7->data = (void *)0x0;
        pvVar7->elemsize = 0;
        pvVar7->elempack = 0;
        pvVar7->dims = 0;
        pvVar7->w = 0;
        pvVar7->h = 0;
        pvVar7->d = 0;
        pvVar7->c = 0;
        pvVar7->cstep = 0;
        pvVar7->refcount = (int *)0x0;
        pvVar7->data = local_660->data;
        pvVar7->refcount = local_660->refcount;
        pvVar7->elemsize = local_660->elemsize;
        pvVar7->elempack = local_660->elempack;
        pvVar7->allocator = local_660->allocator;
        pvVar7->dims = local_660->dims;
        pvVar7->w = local_660->w;
        pvVar7->h = local_660->h;
        pvVar7->d = local_660->d;
        pvVar7->c = local_660->c;
        pvVar7->cstep = local_660->cstep;
      }
      local_68c = 0;
    }
    else {
      Mat::create(in_stack_fffffffffffff410,(int)((ulong)in_stack_fffffffffffff408 >> 0x20),
                  (int)in_stack_fffffffffffff408,(size_t)in_stack_fffffffffffff400,
                  (Allocator *)CONCAT44(in_stack_fffffffffffff3fc,in_stack_fffffffffffff3f8));
      local_5d0 = local_6c8;
      bVar14 = true;
      if (local_6c8->data != (void *)0x0) {
        local_208 = local_6c8;
        bVar14 = local_6c8->cstep * (long)local_6c8->c == 0;
      }
      if (bVar14) {
        local_68c = -100;
      }
      else {
        if (in_RDI[0x34] == 1) {
          if ((in_RDI[0x37] == 0) && (uVar9 = std::__cxx11::string::empty(), (uVar9 & 1) != 0)) {
            local_ad4 = 1.0 / (float)in_RDI[0x35];
          }
          else {
            local_ad4 = (float)local_6cc / (float)local_6e4;
          }
          local_750 = local_ad4;
          for (local_754 = 0; local_754 < local_6d0; local_754 = local_754 + 1) {
            local_4e8 = local_6b8;
            local_4ec = local_754;
            local_760 = (void *)((long)local_6b8->data +
                                (long)local_6b8->w * (long)local_754 * local_6b8->elemsize);
            local_4b8 = local_6c8;
            local_4bc = local_754;
            local_768 = (undefined4 *)
                        ((long)local_6c8->data +
                        (long)local_6c8->w * (long)local_754 * local_6c8->elemsize);
            for (local_76c = 0; local_76c < local_6e4; local_76c = local_76c + 1) {
              local_774 = (int)((float)local_76c * local_750);
              local_778 = local_6cc + -1;
              piVar10 = std::min<int>(&local_774,&local_778);
              local_770 = *piVar10;
              *local_768 = *(undefined4 *)((long)local_760 + (long)local_770 * 4);
              local_768 = local_768 + 1;
            }
          }
        }
        if (in_RDI[0x34] == 2) {
          auVar3._8_8_ = 0;
          auVar3._0_8_ = (long)(local_6e4 * 3);
          uVar9 = SUB168(auVar3 * ZEXT816(4),0);
          if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
            uVar9 = 0xffffffffffffffff;
          }
          pvVar11 = operator_new__(uVar9);
          lVar13 = (long)local_6e4;
          linear_coeffs((int)((ulong)in_stack_fffffffffffff410 >> 0x20),
                        (int)in_stack_fffffffffffff410,in_stack_fffffffffffff408,
                        (float *)in_stack_fffffffffffff400,in_stack_fffffffffffff3fc);
          for (local_794 = 0; local_794 < local_6d0; local_794 = local_794 + 1) {
            local_4f8 = local_6b8;
            local_4fc = local_794;
            pvVar1 = local_6b8->data;
            iVar8 = local_6b8->w;
            sVar2 = local_6b8->elemsize;
            local_4c8 = local_6c8;
            local_4cc = local_794;
            local_7b0 = (float *)((long)pvVar11 + lVar13 * 4);
            local_7a8 = (float *)((long)local_6c8->data +
                                 (long)local_6c8->w * (long)local_794 * local_6c8->elemsize);
            for (local_7b4 = 0; local_7b4 < local_6e4; local_7b4 = local_7b4 + 1) {
              pfVar12 = (float *)((long)pvVar1 +
                                 (long)*(int *)((long)pvVar11 + (long)local_7b4 * 4) * 4 +
                                 (long)iVar8 * (long)local_794 * sVar2);
              *local_7a8 = *pfVar12 * *local_7b0 + pfVar12[1] * local_7b0[1];
              local_7b0 = local_7b0 + 2;
              local_7a8 = local_7a8 + 1;
            }
          }
          if (pvVar11 != (void *)0x0) {
            operator_delete__(pvVar11);
          }
        }
        if (in_RDI[0x34] == 3) {
          auVar4._8_8_ = 0;
          auVar4._0_8_ = (long)(local_6e4 * 5);
          uVar9 = SUB168(auVar4 * ZEXT816(4),0);
          if (SUB168(auVar4 * ZEXT816(4),8) != 0) {
            uVar9 = 0xffffffffffffffff;
          }
          pvVar11 = operator_new__(uVar9);
          lVar13 = (long)local_6e4;
          cubic_coeffs((int)((ulong)in_stack_fffffffffffff410 >> 0x20),
                       (int)in_stack_fffffffffffff410,in_stack_fffffffffffff408,
                       (float *)in_stack_fffffffffffff400,in_stack_fffffffffffff3fc);
          for (local_7e4 = 0; local_7e4 < local_6d0; local_7e4 = local_7e4 + 1) {
            local_508 = local_6b8;
            local_50c = local_7e4;
            pvVar1 = local_6b8->data;
            iVar8 = local_6b8->w;
            sVar2 = local_6b8->elemsize;
            local_4d8 = local_6c8;
            local_4dc = local_7e4;
            local_800 = (float *)((long)pvVar11 + lVar13 * 4);
            local_7f8 = (float *)((long)local_6c8->data +
                                 (long)local_6c8->w * (long)local_7e4 * local_6c8->elemsize);
            for (local_804 = 0; local_804 < local_6e4; local_804 = local_804 + 1) {
              pfVar12 = (float *)((long)pvVar1 +
                                 (long)*(int *)((long)pvVar11 + (long)local_804 * 4) * 4 +
                                 (long)iVar8 * (long)local_7e4 * sVar2);
              *local_7f8 = pfVar12[-1] * *local_800 + *pfVar12 * local_800[1] +
                           pfVar12[1] * local_800[2] + pfVar12[2] * local_800[3];
              local_800 = local_800 + 4;
              local_7f8 = local_7f8 + 1;
            }
          }
          if (pvVar11 != (void *)0x0) {
            operator_delete__(pvVar11);
          }
        }
        local_68c = 0;
      }
    }
  }
  else if ((local_6e4 == local_6cc) && (local_6e8 == local_6d0)) {
    local_678 = local_6c8;
    local_680 = local_6b8;
    if (local_6c8 != local_6b8) {
      if (local_6b8->refcount != (int *)0x0) {
        piVar10 = local_6b8->refcount;
        local_684 = 1;
        LOCK();
        local_688 = *piVar10;
        *piVar10 = *piVar10 + 1;
        UNLOCK();
      }
      local_2d8 = local_6c8;
      if (local_6c8->refcount != (int *)0x0) {
        piVar10 = local_6c8->refcount;
        local_2dc = 0xffffffff;
        LOCK();
        local_2e0 = *piVar10;
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (local_2e0 == 1) {
          if (local_6c8->allocator == (Allocator *)0x0) {
            local_2d0 = local_6c8->data;
            if (local_2d0 != (void *)0x0) {
              free(local_2d0);
            }
          }
          else {
            (*local_6c8->allocator->_vptr_Allocator[3])(local_6c8->allocator,local_6c8->data);
          }
        }
      }
      pvVar7->data = (void *)0x0;
      pvVar7->elemsize = 0;
      pvVar7->elempack = 0;
      pvVar7->dims = 0;
      pvVar7->w = 0;
      pvVar7->h = 0;
      pvVar7->d = 0;
      pvVar7->c = 0;
      pvVar7->cstep = 0;
      pvVar7->refcount = (int *)0x0;
      pvVar7->data = local_680->data;
      pvVar7->refcount = local_680->refcount;
      pvVar7->elemsize = local_680->elemsize;
      pvVar7->elempack = local_680->elempack;
      pvVar7->allocator = local_680->allocator;
      pvVar7->dims = local_680->dims;
      pvVar7->w = local_680->w;
      pvVar7->h = local_680->h;
      pvVar7->d = local_680->d;
      pvVar7->c = local_680->c;
      pvVar7->cstep = local_680->cstep;
    }
    local_68c = 0;
  }
  else {
    Mat::create(in_stack_fffffffffffff420,_w,(int)in_stack_fffffffffffff418,iVar8,
                (size_t)in_stack_fffffffffffff408,in_stack_fffffffffffff400);
    local_5d8 = local_6c8;
    bVar14 = true;
    if (local_6c8->data != (void *)0x0) {
      local_200 = local_6c8;
      bVar14 = local_6c8->cstep * (long)local_6c8->c == 0;
    }
    if (bVar14) {
      local_68c = -100;
    }
    else {
      if (in_RDI[0x34] == 1) {
        if ((in_RDI[0x38] == 0) && (uVar9 = std::__cxx11::string::empty(), (uVar9 & 1) != 0)) {
          local_b0c = 1.0 / (float)in_RDI[0x36];
        }
        else {
          local_b0c = (float)local_6d0 / (float)local_6e8;
        }
        if ((in_RDI[0x37] == 0) && (uVar9 = std::__cxx11::string::empty(), (uVar9 & 1) != 0)) {
          local_b10 = 1.0 / (float)in_RDI[0x35];
        }
        else {
          local_b10 = (float)local_6cc / (float)local_6e4;
        }
        for (in_stack_fffffffffffff7d4 = 0; in_stack_fffffffffffff7d4 < local_6d4;
            in_stack_fffffffffffff7d4 = in_stack_fffffffffffff7d4 + 1) {
          local_460 = &local_880;
          local_1cc = local_6b8->w;
          local_1d0 = local_6b8->h;
          local_1d4 = local_6b8->d;
          in_stack_fffffffffffff7c8 =
               (Mat *)((long)local_6b8->data +
                      local_6b8->cstep * (long)in_stack_fffffffffffff7d4 * local_6b8->elemsize);
          local_1e8 = local_6b8->elemsize;
          local_1ec = local_6b8->elempack;
          local_1f8 = local_6b8->allocator;
          local_1c8 = &local_880;
          uVar18 = 1;
          local_8 = (long)local_1cc * (long)(int)in_stack_fffffffffffff7b0 * local_1e8;
          local_450 = &local_880;
          local_638 = &local_880;
          uVar18 = 0;
          uVar18 = 0;
          local_570 = &local_8d0;
          local_ec = local_6c8->w;
          local_f0 = local_6c8->h;
          local_f4 = local_6c8->d;
          local_888 = (undefined4 *)
                      ((long)local_6c8->data +
                      local_6c8->cstep * (long)in_stack_fffffffffffff7d4 * local_6c8->elemsize);
          local_108 = local_6c8->elemsize;
          local_10c = local_6c8->elempack;
          local_118 = local_6c8->allocator;
          local_e8 = &local_8d0;
          local_48 = (long)local_ec * (long)local_f0 * local_108;
          local_448 = &local_8d0;
          local_628 = &local_8d0;
          local_868 = 0;
          local_870 = 0;
          local_878 = 0;
          local_880 = 0;
          local_c = 0x10;
          local_4c = 0x10;
          local_468 = local_6b8;
          local_46d = 1;
          local_578 = local_6c8;
          local_57d = 1;
          in_stack_fffffffffffff7c0 = (float *)0x0;
          in_stack_fffffffffffff7ac = 0;
          in_stack_fffffffffffff7a8 = 0;
          local_8d0 = 0;
          local_8c0 = 0;
          local_8b8 = 0;
          local_8a8 = 0;
          local_8a4 = 0;
          local_8a0 = 0;
          local_89c = 0;
          local_898 = 0;
          local_890 = 0;
          local_8c8 = 0;
          local_57c = in_stack_fffffffffffff7d4;
          local_46c = in_stack_fffffffffffff7d4;
          local_338 = local_628;
          local_318 = local_638;
          local_1e0 = in_stack_fffffffffffff7c8;
          local_100 = local_888;
          local_8b0 = local_118;
          local_860 = local_1f8;
          for (local_8d4 = 0; local_8d4 < local_6e8; local_8d4 = local_8d4 + 1) {
            local_8dc = (int)((float)local_8d4 * local_b0c);
            local_8e0 = local_6d0 + -1;
            piVar10 = std::min<int>(&local_8dc,&local_8e0);
            local_8d8 = *piVar10;
            for (local_8e4 = 0; local_8e4 < local_6e4; local_8e4 = local_8e4 + 1) {
              local_8ec = (int)((float)local_8e4 * local_b10);
              local_8f0 = local_6cc + -1;
              piVar10 = std::min<int>(&local_8ec,&local_8f0);
              local_8e8 = *piVar10;
              *local_888 = *(undefined4 *)
                            ((long)&in_stack_fffffffffffff7c8->data +
                            (long)(local_8d8 * local_6cc + local_8e8) * 4);
              local_888 = local_888 + 1;
            }
          }
        }
      }
      if (in_RDI[0x34] == 2) {
        auVar5._8_8_ = 0;
        auVar5._0_8_ = (long)(local_6e4 * 3 + local_6e8 * 3);
        uVar9 = SUB168(auVar5 * ZEXT816(4),0);
        if (SUB168(auVar5 * ZEXT816(4),8) != 0) {
          uVar9 = 0xffffffffffffffff;
        }
        local_900 = operator_new__(uVar9);
        local_908 = (void *)((long)local_900 + (long)local_6e4 * 4);
        local_910 = (long)local_900 + (long)local_6e8 * 4 + (long)local_6e4 * 4;
        local_918 = (long)local_900 +
                    (long)(local_6e4 << 1) * 4 + (long)local_6e8 * 4 + (long)local_6e4 * 4;
        local_8f8 = local_900;
        linear_coeffs((int)((ulong)in_stack_fffffffffffff410 >> 0x20),(int)in_stack_fffffffffffff410
                      ,in_stack_fffffffffffff408,(float *)in_stack_fffffffffffff400,
                      in_stack_fffffffffffff3fc);
        linear_coeffs((int)((ulong)in_stack_fffffffffffff410 >> 0x20),(int)in_stack_fffffffffffff410
                      ,in_stack_fffffffffffff408,(float *)in_stack_fffffffffffff400,
                      in_stack_fffffffffffff3fc);
        for (local_91c = 0; local_91c < local_6d4; local_91c = local_91c + 1) {
          local_480 = &local_968;
          local_194 = local_6b8->w;
          local_198 = local_6b8->h;
          local_19c = local_6b8->d;
          local_1a8 = (void *)((long)local_6b8->data +
                              local_6b8->cstep * (long)local_91c * local_6b8->elemsize);
          local_1b0 = local_6b8->elemsize;
          local_1b4 = local_6b8->elempack;
          local_1c0 = local_6b8->allocator;
          local_190 = &local_968;
          local_960 = (int *)0x0;
          local_934 = 1;
          local_18 = (long)local_194 * (long)local_198 * local_1b0;
          local_928 = (local_18 + 0xfU & 0xfffffffffffffff0) / local_1b0;
          local_940 = local_6b8->dims + -1;
          if (local_6b8->dims == 4) {
            local_928 = (long)local_6b8->w * (long)local_6b8->h;
          }
          local_590 = &local_9b0;
          local_b4 = local_6c8->w;
          local_b8 = local_6c8->h;
          local_bc = local_6c8->d;
          local_c8 = (void *)((long)local_6c8->data +
                             local_6c8->cstep * (long)local_91c * local_6c8->elemsize);
          local_d0 = local_6c8->elemsize;
          local_d4 = local_6c8->elempack;
          local_e0 = local_6c8->allocator;
          local_b0 = &local_9b0;
          local_9a8 = (int *)0x0;
          local_97c = 1;
          local_58 = (long)local_b4 * (long)local_b8 * local_d0;
          local_970 = (local_58 + 0xfU & 0xfffffffffffffff0) / local_d0;
          local_988 = local_6c8->dims + -1;
          if (local_6c8->dims == 4) {
            local_970 = (long)local_6c8->w * (long)local_6c8->h;
          }
          local_1c = 0x10;
          local_5c = 0x10;
          local_488 = local_6b8;
          local_48c = local_91c;
          local_48d = 1;
          local_598 = local_6c8;
          local_59c = local_91c;
          local_59d = 1;
          local_9b0 = local_c8;
          local_9a0 = local_d0;
          local_998 = local_d4;
          local_990 = local_e0;
          local_984 = local_b4;
          local_980 = local_b8;
          local_978 = local_bc;
          local_968 = local_1a8;
          local_958 = local_1b0;
          local_950 = local_1b4;
          local_948 = local_1c0;
          local_93c = local_194;
          local_938 = local_198;
          local_930 = local_19c;
          resize_bilinear_image
                    (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0,
                     in_stack_fffffffffffff598,in_stack_fffffffffffff590,in_RDI);
          local_618 = &local_9b0;
          local_358 = local_618;
          if (local_9a8 != (int *)0x0) {
            local_35c = 0xffffffff;
            LOCK();
            local_360 = *local_9a8;
            *local_9a8 = *local_9a8 + -1;
            UNLOCK();
            if (local_360 == 1) {
              if (local_990 == (Allocator *)0x0) {
                local_290 = local_9b0;
                if (local_9b0 != (void *)0x0) {
                  free(local_9b0);
                }
              }
              else {
                (*local_990->_vptr_Allocator[3])(local_990,local_9b0);
              }
            }
          }
          local_9b0 = (void *)0x0;
          local_9a0 = 0;
          local_998 = 0;
          local_988 = 0;
          local_984 = 0;
          local_980 = 0;
          local_97c = 0;
          local_978 = 0;
          local_970 = 0;
          local_9a8 = (int *)0x0;
          local_608 = &local_968;
          local_378 = local_608;
          if (local_960 != (int *)0x0) {
            local_37c = 0xffffffff;
            LOCK();
            local_380 = *local_960;
            *local_960 = *local_960 + -1;
            UNLOCK();
            if (local_380 == 1) {
              if (local_948 == (Allocator *)0x0) {
                local_280 = local_968;
                if (local_968 != (void *)0x0) {
                  free(local_968);
                }
              }
              else {
                (*local_948->_vptr_Allocator[3])(local_948,local_968);
              }
            }
          }
          local_968 = (void *)0x0;
          local_958 = 0;
          local_950 = 0;
          local_940 = 0;
          local_93c = 0;
          local_938 = 0;
          local_934 = 0;
          local_930 = 0;
          local_928 = 0;
          local_960 = (int *)0x0;
        }
        if (local_8f8 != (void *)0x0) {
          operator_delete__(local_8f8);
        }
      }
      if (in_RDI[0x34] == 3) {
        auVar6._8_8_ = 0;
        auVar6._0_8_ = (long)(local_6e4 * 5 + local_6e8 * 5);
        uVar9 = SUB168(auVar6 * ZEXT816(4),0);
        if (SUB168(auVar6 * ZEXT816(4),8) != 0) {
          uVar9 = 0xffffffffffffffff;
        }
        local_9c0 = operator_new__(uVar9);
        local_9c8 = (void *)((long)local_9c0 + (long)local_6e4 * 4);
        local_9d0 = (long)local_9c0 + (long)local_6e8 * 4 + (long)local_6e4 * 4;
        local_9d8 = (long)local_9c0 +
                    (long)(local_6e4 << 2) * 4 + (long)local_6e8 * 4 + (long)local_6e4 * 4;
        local_9b8 = local_9c0;
        cubic_coeffs((int)((ulong)in_stack_fffffffffffff410 >> 0x20),(int)in_stack_fffffffffffff410,
                     in_stack_fffffffffffff408,(float *)in_stack_fffffffffffff400,
                     in_stack_fffffffffffff3fc);
        cubic_coeffs((int)((ulong)in_stack_fffffffffffff410 >> 0x20),(int)in_stack_fffffffffffff410,
                     in_stack_fffffffffffff408,(float *)in_stack_fffffffffffff400,
                     in_stack_fffffffffffff3fc);
        for (local_9dc = 0; local_9dc < local_6d4; local_9dc = local_9dc + 1) {
          local_4a0 = &local_a28;
          local_15c = local_6b8->w;
          local_160 = local_6b8->h;
          local_164 = local_6b8->d;
          local_170 = (void *)((long)local_6b8->data +
                              local_6b8->cstep * (long)local_9dc * local_6b8->elemsize);
          local_178 = local_6b8->elemsize;
          local_17c = local_6b8->elempack;
          local_188 = local_6b8->allocator;
          local_158 = &local_a28;
          local_a20 = (int *)0x0;
          local_9f4 = 1;
          local_28 = (long)local_15c * (long)local_160 * local_178;
          local_9e8 = (local_28 + 0xfU & 0xfffffffffffffff0) / local_178;
          local_a00 = local_6b8->dims + -1;
          if (local_6b8->dims == 4) {
            local_9e8 = (long)local_6b8->w * (long)local_6b8->h;
          }
          local_5b0 = &stack0xfffffffffffff590;
          local_7c = local_6c8->w;
          local_80 = local_6c8->h;
          local_84 = local_6c8->d;
          pvVar11 = (void *)((long)local_6c8->data +
                            local_6c8->cstep * (long)local_9dc * local_6c8->elemsize);
          local_98 = local_6c8->elemsize;
          local_9c = local_6c8->elempack;
          pAVar17 = local_6c8->allocator;
          local_78 = &stack0xfffffffffffff590;
          local_68 = (long)local_7c * (long)local_80 * local_98;
          local_2c = 0x10;
          local_6c = 0x10;
          local_4a8 = local_6b8;
          local_4ac = local_9dc;
          local_4ad = 1;
          local_5b8 = local_6c8;
          local_5bc = local_9dc;
          local_5bd = 1;
          piVar10 = (int *)0x0;
          local_a8 = pAVar17;
          local_90 = pvVar11;
          local_a28 = local_170;
          local_a18 = local_178;
          local_a10 = local_17c;
          local_a08 = local_188;
          local_9fc = local_15c;
          local_9f8 = local_160;
          local_9f0 = local_164;
          resize_bicubic_image
                    ((Mat *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                     in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,
                     in_stack_fffffffffffff7b0,
                     (int *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
          puVar16 = (undefined8 *)&stack0xfffffffffffff590;
          local_5f8 = puVar16;
          local_398 = puVar16;
          if (piVar10 != (int *)0x0) {
            local_39c = 0xffffffff;
            LOCK();
            local_3a0 = *piVar10;
            *piVar10 = *piVar10 + -1;
            UNLOCK();
            if (local_3a0 == 1) {
              if (pAVar17 == (Allocator *)0x0) {
                if (pvVar11 != (void *)0x0) {
                  free(pvVar11);
                }
              }
              else {
                (*pAVar17->_vptr_Allocator[3])(pAVar17,pvVar11);
              }
            }
          }
          *puVar16 = 0;
          puVar16[2] = 0;
          *(undefined4 *)(puVar16 + 3) = 0;
          *(undefined4 *)(puVar16 + 5) = 0;
          *(undefined4 *)((long)puVar16 + 0x2c) = 0;
          *(undefined4 *)(puVar16 + 6) = 0;
          *(undefined4 *)((long)puVar16 + 0x34) = 0;
          *(undefined4 *)(puVar16 + 7) = 0;
          puVar16[8] = 0;
          puVar16[1] = 0;
          ppvVar15 = &local_a28;
          local_5e8 = ppvVar15;
          local_3b8 = ppvVar15;
          if (local_a20 != (int *)0x0) {
            local_3bc = 0xffffffff;
            LOCK();
            local_3c0 = *local_a20;
            *local_a20 = *local_a20 + -1;
            UNLOCK();
            if (local_3c0 == 1) {
              if (local_a08 == (Allocator *)0x0) {
                local_260 = local_a28;
                if (local_a28 != (void *)0x0) {
                  free(local_a28);
                }
              }
              else {
                (*local_a08->_vptr_Allocator[3])(local_a08,local_a28);
              }
            }
          }
          *ppvVar15 = (void *)0x0;
          ppvVar15[2] = (void *)0x0;
          *(undefined4 *)(ppvVar15 + 3) = 0;
          *(undefined4 *)(ppvVar15 + 5) = 0;
          *(undefined4 *)((long)ppvVar15 + 0x2c) = 0;
          *(undefined4 *)(ppvVar15 + 6) = 0;
          *(undefined4 *)((long)ppvVar15 + 0x34) = 0;
          *(undefined4 *)(ppvVar15 + 7) = 0;
          ppvVar15[8] = (void *)0x0;
          ppvVar15[1] = (void *)0x0;
        }
        if (local_9b8 != (void *)0x0) {
          operator_delete__(local_9b8);
        }
      }
      local_68c = 0;
    }
  }
  return local_68c;
}

Assistant:

int Interp::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& reference_blob = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    int outw = reference_blob.w;
    int outh = reference_blob.h;

    if (!size_expr.empty())
    {
        int r = eval_size_expr(bottom_blobs, outw, outh);
        if (r != 0)
            return -1;
    }

    if (dims == 1)
    {
        // special case for 2d resize on flattened blob
        top_blob.create(outw, outh, w, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < w; q++)
        {
            Mat top_blob_c = top_blob.channel(q);
            const float v = bottom_blob[q];
            top_blob_c.fill(v);
        }

        return 0;
    }

    if (dims == 2)
    {
        if (outw == w)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(outw, h, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (resize_type == 1) // nearest
        {
            const float ws = (output_width || !size_expr.empty()) ? w / (float)outw : 1.f / width_scale;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int y = 0; y < h; y++)
            {
                const float* ptr = bottom_blob.row(y);
                float* outptr = top_blob.row(y);
                for (int x = 0; x < outw; x++)
                {
                    int in_x = std::min((int)(x * ws), (w - 1));
                    *outptr++ = ptr[in_x];
                }
            }
        }

        if (resize_type == 2) // bilinear
        {
            int* buf = new int[outw + outw * 2];

            int* xofs = buf;
            float* alpha = (float*)(buf + outw);

            linear_coeffs(w, outw, xofs, alpha, align_corner);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int y = 0; y < h; y++)
            {
                const float* ptr = bottom_blob.row(y);
                float* outptr = top_blob.row(y);
                const float* alphap = alpha;

                for (int x = 0; x < outw; x++)
                {
                    int sx = xofs[x];
                    const float* Sp = ptr + sx;
                    float a0 = alphap[0];
                    float a1 = alphap[1];
                    *outptr++ = Sp[0] * a0 + Sp[1] * a1;
                    alphap += 2;
                }
            }

            delete[] buf;
        }

        if (resize_type == 3) // bicubic
        {
            int* buf = new int[outw + outw * 4];

            int* xofs = buf;
            float* alpha = (float*)(buf + outw);

            cubic_coeffs(w, outw, xofs, alpha, align_corner);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int y = 0; y < h; y++)
            {
                const float* ptr = bottom_blob.row(y);
                float* outptr = top_blob.row(y);
                const float* alphap = alpha;

                for (int x = 0; x < outw; x++)
                {
                    int sx = xofs[x];
                    const float* Sp = ptr + sx;
                    float a0 = alphap[0];
                    float a1 = alphap[1];
                    float a2 = alphap[2];
                    float a3 = alphap[3];
                    *outptr++ = Sp[-1] * a0 + Sp[0] * a1 + Sp[1] * a2 + Sp[2] * a3;
                    alphap += 4;
                }
            }

            delete[] buf;
        }

        return 0;
    }

    if (outw == w && outh == h)
    {
        top_blob = bottom_blob;
        return 0;
    }

    top_blob.create(outw, outh, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (resize_type == 1) // nearest
    {
        const float hs = (output_height || !size_expr.empty()) ? h / (float)outh : 1.f / height_scale;
        const float ws = (output_width || !size_expr.empty()) ? w / (float)outw : 1.f / width_scale;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);
            for (int y = 0; y < outh; y++)
            {
                int in_y = std::min((int)(y * hs), (h - 1));
                for (int x = 0; x < outw; x++)
                {
                    int in_x = std::min((int)(x * ws), (w - 1));
                    *outptr++ = ptr[in_y * w + in_x];
                }
            }
        }
    }

    if (resize_type == 2) // bilinear
    {
        int* buf = new int[outw + outh + outw * 2 + outh * 2];

        int* xofs = buf;        //new int[outw];
        int* yofs = buf + outw; //new int[outh];

        float* alpha = (float*)(buf + outw + outh);           //new float[outw * 2];
        float* beta = (float*)(buf + outw + outh + outw * 2); //new float[outh * 2];

        linear_coeffs(w, outw, xofs, alpha, align_corner);
        linear_coeffs(h, outh, yofs, beta, align_corner);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; ++q)
        {
            const Mat src = bottom_blob.channel(q);
            Mat dst = top_blob.channel(q);

            resize_bilinear_image(src, dst, alpha, xofs, beta, yofs);
        }

        delete[] buf;
    }

    if (resize_type == 3) // bicubic
    {
        int* buf = new int[outw + outh + outw * 4 + outh * 4];

        int* xofs = buf;        //new int[outw];
        int* yofs = buf + outw; //new int[outh];

        float* alpha = (float*)(buf + outw + outh);           //new float[outw * 4];
        float* beta = (float*)(buf + outw + outh + outw * 4); //new float[outh * 4];

        cubic_coeffs(w, outw, xofs, alpha, align_corner);
        cubic_coeffs(h, outh, yofs, beta, align_corner);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const Mat src = bottom_blob.channel(q);
            Mat dst = top_blob.channel(q);

            resize_bicubic_image(src, dst, alpha, xofs, beta, yofs);
        }

        delete[] buf;
    }

    return 0;
}